

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  FunctionBody *functionBody;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var value;
  
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  value = JavascriptOperators::PatchGetValue<false,Js::InlineCache>
                    (functionBody,inlineCache,(uint)playout->inlineCacheIndex,instance,propertyId);
  SetReg<unsigned_short>(this,playout->Value,value);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetProperty_NoFastPath(Var instance, unaligned T* playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);

        Var value = JavascriptOperators::PatchGetValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            instance,
            propertyId
            );

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, true);
        }
#endif

        SetReg(playout->Value, value);
    }